

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator<char>
fmt::v5::internal::
format_decimal<char,unsigned_int,fmt::v5::internal::counting_iterator<char>,fmt::v5::internal::no_thousands_sep>
          (char *param_1,undefined1 param_2,undefined4 param_3,undefined4 param_4)

{
  type tVar1;
  counting_iterator<char> cVar2;
  char *end;
  char_type buffer [13];
  counting_iterator<char> in_stack_ffffffffffffffa8;
  undefined1 local_39 [13];
  undefined4 local_2c;
  undefined4 local_28;
  char *local_20;
  undefined1 uStack_18;
  undefined7 uStack_17;
  
  local_2c = param_4;
  local_28 = param_3;
  local_20 = param_1;
  uStack_18 = param_2;
  format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>(local_39,param_3,param_4);
  tVar1 = copy_str<char,char*,fmt::v5::internal::counting_iterator<char>>
                    ((char *)CONCAT71(uStack_17,uStack_18),local_20,in_stack_ffffffffffffffa8);
  cVar2.count_ = tVar1.count_;
  cVar2.blackhole_ = tVar1.blackhole_;
  cVar2._9_7_ = tVar1._9_7_;
  return cVar2;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}